

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O0

v_field ConstTpl::readHandleSelector(string *name)

{
  bool bVar1;
  LowlevelError *this;
  allocator local_39;
  string local_38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *name_local;
  
  local_18 = name;
  bVar1 = std::operator==(name,"space");
  if (bVar1) {
    name_local._4_4_ = v_space;
  }
  else {
    bVar1 = std::operator==(local_18,"offset");
    if (bVar1) {
      name_local._4_4_ = v_offset;
    }
    else {
      bVar1 = std::operator==(local_18,"size");
      if (bVar1) {
        name_local._4_4_ = v_size;
      }
      else {
        bVar1 = std::operator==(local_18,"offset_plus");
        if (!bVar1) {
          this = (LowlevelError *)__cxa_allocate_exception(0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_38,"Bad handle selector",&local_39);
          LowlevelError::LowlevelError(this,(string *)local_38);
          __cxa_throw(this,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
        }
        name_local._4_4_ = v_offset_plus;
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

ConstTpl::v_field ConstTpl::readHandleSelector(const string &name)

{
  if (name == "space")
    return v_space;
  if (name == "offset")
    return v_offset;
  if (name == "size")
    return v_size;
  if (name == "offset_plus")
    return v_offset_plus;
  throw LowlevelError("Bad handle selector");
}